

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::generate_swift_struct_hashable_extension
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_private)

{
  t_field *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  reference pptVar4;
  string *psVar5;
  char *local_d8;
  t_field *tfield_1;
  t_field **local_b0;
  string local_a8;
  t_field *local_88;
  t_field *tfield;
  t_field **local_78;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_70;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  allocator local_49;
  string local_48 [8];
  string visibility;
  bool is_private_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  if (is_private) {
    local_d8 = "fileprivate";
    if ((this->gen_cocoa_ & 1U) != 0) {
      local_d8 = "private";
    }
  }
  else {
    local_d8 = "public";
  }
  visibility.field_2._M_local_buf[0xf] = is_private;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,local_d8,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"extension ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  std::operator<<(poVar3," : Hashable");
  block_open(this,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,local_48);
  std::operator<<(poVar3," func hash(into hasher: inout Hasher)");
  block_open(this,out);
  m_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_70);
  bVar1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
  if (!bVar1) {
    bVar1 = t_struct::is_union(tstruct);
    if (bVar1) {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"switch self {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      local_b0 = (t_field **)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
      local_70._M_current = local_b0;
      while( true ) {
        tfield_1 = (t_field *)
                   std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                             ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_70,
                           (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                            *)&tfield_1);
        if (!bVar1) break;
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_70);
        this_00 = *pptVar4;
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"case .");
        psVar5 = t_field::get_name_abi_cxx11_(this_00);
        poVar3 = std::operator<<(poVar3,(string *)psVar5);
        poVar3 = std::operator<<(poVar3,"(let val): hasher.combine(val)");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_70,0);
      }
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"}");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
    else {
      local_78 = (t_field **)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
      local_70._M_current = local_78;
      while( true ) {
        tfield = (t_field *)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                           ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_70,
                           (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                            *)&tfield);
        if (!bVar1) break;
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_70);
        local_88 = *pptVar4;
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"hasher.combine(");
        psVar5 = t_field::get_name_abi_cxx11_(local_88);
        maybe_escape_identifier(&local_a8,this,psVar5);
        poVar3 = std::operator<<(poVar3,(string *)&local_a8);
        poVar3 = std::operator<<(poVar3,")");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_a8);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_70);
      }
    }
  }
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void t_swift_generator::generate_swift_struct_hashable_extension(ostream& out,
                                                                 t_struct* tstruct,
                                                                 bool is_private) {

  string visibility = is_private ? (gen_cocoa_ ? "private" : "fileprivate") : "public";
  indent(out) << "extension " << tstruct->get_name() << " : Hashable";
  block_open(out);
  out << endl;
  indent(out) << visibility << " func hash(into hasher: inout Hasher)";
  block_open(out);

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  if (!members.empty()) {
    if (!tstruct->is_union()) {
      for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        t_field* tfield = *m_iter;
        indent(out) << "hasher.combine(" << maybe_escape_identifier(tfield->get_name()) << ")" << endl;
      }
    } else {
      indent(out) << "switch self {" << endl;
      for (m_iter = members.begin(); m_iter != members.end(); m_iter++) {
        t_field *tfield = *m_iter;
        indent(out) << "case ." << tfield->get_name() << "(let val): hasher.combine(val)" << endl;
      }
      indent(out) << "}" << endl << endl;
    }
  }
  block_close(out);
  out << endl;
  block_close(out);
  out << endl;
}